

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::buildTargets((anonymous_namespace)::BuildContext&,std::vector<std::__cxx11::
string,std::allocator<std::__cxx11::string>>const&)::TargetsTask::inputsAvailable(llbuild::core::
TaskInterface_(void *this,TaskInterface ti)

{
  ValueType local_98;
  TaskInterface local_80;
  BuildValue local_70;
  
  local_80.ctx = ti.ctx;
  local_80.impl = ti.impl;
  local_70.valueData._65_7_ = 0;
  local_70.valueData._72_8_ = 0;
  local_70.valueData._49_8_ = 0;
  local_70.valueData._57_7_ = 0;
  local_70.valueData.asOutputInfo.checksum.bytes[0x10] = '\0';
  local_70.kind = SuccessfulCommand;
  local_70.numOutputInfos = 1;
  local_70.commandHash.value = 0;
  local_70.valueData.asOutputInfo.device = 0;
  local_70.valueData.asOutputInfo.inode = 0;
  local_70.valueData.asOutputInfo.mode = 0;
  local_70.valueData.asOutputInfo.size = 0;
  local_70.valueData.asOutputInfo.modTime.seconds = 0;
  local_70.valueData.asOutputInfo.modTime.nanoseconds = 0;
  local_70.valueData.asOutputInfo.checksum.bytes[0] = '\0';
  anon_unknown.dwarf_b0fca::BuildValue::toValue(&local_98,&local_70);
  llbuild::core::TaskInterface::complete(&local_80,&local_98,false);
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      // Complete the job.
      ti.complete(
        BuildValue::makeSuccessfulCommand({}, CommandSignature()).toValue());
      return;
    }